

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

void __thiscall
gl4cts::BufferTextureStorageTestCase::deinitTestCaseGlobal(BufferTextureStorageTestCase *this)

{
  if (this->m_helper_bo != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_helper_bo);
    this->m_helper_bo = 0;
  }
  if (this->m_helper_bo_data != (uchar *)0x0) {
    operator_delete__(this->m_helper_bo_data);
    this->m_helper_bo_data = (uchar *)0x0;
  }
  if (this->m_po != 0) {
    (*this->m_gl->deleteProgram)(this->m_po);
    this->m_po = 0;
  }
  if (this->m_ssbo != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_ssbo);
    this->m_ssbo = 0;
  }
  if (this->m_ssbo_zero_data != (uchar *)0x0) {
    operator_delete__(this->m_ssbo_zero_data);
    this->m_ssbo_zero_data = (uchar *)0x0;
  }
  if (this->m_to != 0) {
    (*this->m_gl->deleteTextures)(1,&this->m_to);
    this->m_to = 0;
  }
  return;
}

Assistant:

void BufferTextureStorageTestCase::deinitTestCaseGlobal()
{
	if (m_helper_bo != 0)
	{
		m_gl.deleteBuffers(1, &m_helper_bo);

		m_helper_bo = 0;
	}

	if (m_helper_bo_data != DE_NULL)
	{
		delete[] m_helper_bo_data;

		m_helper_bo_data = DE_NULL;
	}

	if (m_po != 0)
	{
		m_gl.deleteProgram(m_po);

		m_po = 0;
	}

	if (m_ssbo != 0)
	{
		m_gl.deleteBuffers(1, &m_ssbo);

		m_ssbo = 0;
	}

	if (m_ssbo_zero_data != DE_NULL)
	{
		delete[] m_ssbo_zero_data;

		m_ssbo_zero_data = DE_NULL;
	}

	if (m_to != 0)
	{
		m_gl.deleteTextures(1, &m_to);

		m_to = 0;
	}
}